

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvmapImage.cpp
# Opt level: O3

void __thiscall EnvmapImage::EnvmapImage(EnvmapImage *this,Envmap type,Box2i *dataWindow)

{
  int iVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  Rgba *pRVar5;
  long lVar6;
  
  this->_type = type;
  (this->_dataWindow).min = dataWindow->min;
  iVar1 = (dataWindow->max).x;
  (this->_dataWindow).max.x = iVar1;
  iVar2 = (dataWindow->max).y;
  (this->_dataWindow).max.y = iVar2;
  lVar6 = (long)((iVar2 - (dataWindow->min).y) + 1);
  lVar3 = (long)((iVar1 - (dataWindow->min).x) + 1);
  (this->_pixels)._sizeX = lVar6;
  (this->_pixels)._sizeY = lVar3;
  uVar4 = lVar3 * lVar6;
  pRVar5 = (Rgba *)operator_new__(-(ulong)(uVar4 >> 0x3d != 0) | uVar4 * 8);
  (this->_pixels)._data = pRVar5;
  clear(this);
  return;
}

Assistant:

EnvmapImage::EnvmapImage (Envmap type, const Box2i& dataWindow)
    : _type (type)
    , _dataWindow (dataWindow)
    , _pixels (
          dataWindow.max.y - dataWindow.min.y + 1,
          dataWindow.max.x - dataWindow.min.x + 1)
{
    clear ();
}